

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

void Extra_ThreshCheckTest(void)

{
  uint uVar1;
  uint uVar2;
  int Chow0;
  uint iVar;
  word t;
  int Weights [16];
  int Chow [16];
  
  t = 0xa888888088808880;
  for (iVar = 0; iVar != 6; iVar = iVar + 1) {
    uVar1 = Abc_TtPosVar(&t,6,iVar);
    uVar2 = Abc_TtNegVar(&t,6,iVar);
    printf("%d %d %d\n",(ulong)iVar,(ulong)uVar1,(ulong)uVar2);
  }
  Extra_ThreshComputeChow(&t,6,Chow);
  Chow0 = Extra_ThreshCheck(&t,6,Weights);
  if (Chow0 == 0) {
    puts("No threshold");
  }
  else {
    Extra_ThreshPrintChow(Chow0,Weights,6);
  }
  return;
}

Assistant:

void Extra_ThreshCheckTest() {
    int nVars = 6;
    int T, Chow0, Chow[16], Weights[16];
//    word t =  s_Truths6[0] & s_Truths6[1] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4];
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[4]);
//    word t = (s_Truths6[2] & s_Truths6[1])
//            | (s_Truths6[2] & s_Truths6[0] & s_Truths6[3])
//            | (s_Truths6[2] & s_Truths6[0] & ~s_Truths6[4]);
    word t = (s_Truths6[0] & s_Truths6[1] & s_Truths6[2])| (s_Truths6[0] & s_Truths6[1] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]);
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2]) | (s_Truths6[0] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]) | 
//        (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[5]);
    int i;
    assert(nVars <= 8);
    for (i = 0; i < nVars; i++)
        printf("%d %d %d\n", i, Abc_TtPosVar(&t, nVars, i),
                Abc_TtNegVar(&t, nVars, i));
//    word t = s_Truths6[0] & s_Truths6[1] & s_Truths6[2];
    Chow0 = Extra_ThreshComputeChow(&t, nVars, Chow);
    if ((T = Extra_ThreshCheck(&t, nVars, Weights)))
        Extra_ThreshPrintChow(T, Weights, nVars);
    else
        printf("No threshold\n");
}